

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::PathPtr::endsWith(PathPtr *this,PathPtr suffix)

{
  ulong uVar1;
  bool bVar2;
  ArrayPtr<const_kj::String> local_20;
  ArrayPtr<const_kj::String> local_10;
  
  local_20.size_ = suffix.parts.size_;
  local_20.ptr = suffix.parts.ptr;
  uVar1 = (this->parts).size_;
  if (uVar1 < local_20.size_) {
    bVar2 = false;
  }
  else {
    local_10.ptr = (this->parts).ptr + (uVar1 - local_20.size_);
    local_10.size_ = local_20.size_;
    bVar2 = ArrayPtr<const_kj::String>::operator==(&local_10,&local_20);
  }
  return bVar2;
}

Assistant:

bool PathPtr::endsWith(PathPtr suffix) const {
  return parts.size() >= suffix.parts.size() &&
         parts.slice(parts.size() - suffix.parts.size(), parts.size()) == suffix.parts;
}